

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser2_syntax.c
# Opt level: O0

int av1d_fill_picparams(Av1CodecContext *ctx,DXVA_PicParams_AV1 *pp)

{
  char cVar1;
  byte bVar2;
  void *pvVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  UCHAR UVar7;
  RockchipSocType RVar8;
  int iVar9;
  RK_U32 RVar10;
  long lVar11;
  bool bVar12;
  ushort local_7c;
  AV1Frame *ref_frame_1;
  RefInfo_conflict *ref_i;
  AV1Frame *ref_frame;
  UCHAR aUStack_54 [3];
  int8_t ref_idx;
  int apply_grain;
  uchar remap_lr_type [4];
  AV1RawFilmGrainParams *film_grain;
  AV1RawFrameHeader *frame_header;
  AV1RawSequenceHeader *seq;
  AV1Context *h;
  RK_U8 is_rk3588;
  int uses_lr;
  int loop_cnt;
  int j;
  int i;
  DXVA_PicParams_AV1 *pp_local;
  Av1CodecContext *ctx_local;
  
  pvVar3 = ctx->priv_data;
  pbVar4 = *(byte **)((long)pvVar3 + 0x58);
  pbVar5 = *(byte **)((long)pvVar3 + 0x68);
  _apply_grain = (char *)((long)pvVar3 + 0x1aae);
  _aUStack_54 = 0x2010300;
  cVar1 = *_apply_grain;
  memset(pp,0,0xca0);
  pp->width = (USHORT)*(undefined4 *)((long)pvVar3 + 0x1ba4);
  pp->height = (USHORT)*(undefined4 *)((long)pvVar3 + 0x1ba8);
  pp->max_width = *(short *)(pbVar4 + 0x226) + 1;
  pp->max_height = *(short *)(pbVar4 + 0x228) + 1;
  (pp->CurrPic).field_0.bPicEntry =
       (pp->CurrPic).field_0.bPicEntry & 0x80 | (byte)*(undefined4 *)((long)pvVar3 + 0x1870) & 0x7f;
  pp->CurrPicTextureIndex = (USHORT)*(undefined4 *)((long)pvVar3 + 0x1870);
  if (pbVar5[0xa2] == 0) {
    local_7c = 8;
  }
  else {
    local_7c = (ushort)pbVar5[0xa3];
  }
  pp->superres_denom = local_7c;
  pp->bitdepth = (USHORT)*(undefined4 *)((long)pvVar3 + 0x1b9c);
  pp->seq_profile = (ushort)*pbVar4;
  pp->frame_header_size = (USHORT)*(undefined8 *)((long)pvVar3 + 0xa0);
  (pp->tiles).cols = *(USHORT *)(pbVar5 + 0x172);
  (pp->tiles).rows = *(USHORT *)(pbVar5 + 0x174);
  (pp->tiles).context_update_id = *(USHORT *)(pbVar5 + 0x16e);
  for (loop_cnt = 0; loop_cnt < (int)(uint)(pp->tiles).cols; loop_cnt = loop_cnt + 1) {
    (pp->tiles).widths[loop_cnt] = pbVar5[(long)loop_cnt + 0xed] + 1;
  }
  for (loop_cnt = 0; loop_cnt < (int)(uint)(pp->tiles).rows; loop_cnt = loop_cnt + 1) {
    (pp->tiles).heights[loop_cnt] = pbVar5[(long)loop_cnt + 0x12d] + 1;
  }
  for (loop_cnt = 0; loop_cnt < 0x80; loop_cnt = loop_cnt + 1) {
    (pp->tiles).tile_offset_start[loop_cnt] =
         *(UINT32 *)((long)pvVar3 + (long)loop_cnt * 4 + 0x1cfc4);
    (pp->tiles).tile_offset_end[loop_cnt] = *(UINT32 *)((long)pvVar3 + (long)loop_cnt * 4 + 0x1d1c4)
    ;
  }
  (pp->tiles).tile_sz_mag = *(UCHAR *)(*(long *)((long)pvVar3 + 0x68) + 0x170);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffffff000 |
                 (ulong)*(ushort *)(pbVar4 + (long)*(int *)((long)pvVar3 + 0x1b98) * 2 + 0x24) &
                 0xfff);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffffffefff | ((ulong)pbVar4[0x22d] & 1) << 0xc);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffffffdfff | ((ulong)pbVar4[0x22f] & 1) << 0xd);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffffffbfff | ((ulong)pbVar4[0x230] & 1) << 0xe);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffffff7fff | ((ulong)pbVar4[0x231] & 1) << 0xf);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffffeffff | ((ulong)pbVar5[0x292] & 1) << 0x10);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffffdffff | ((ulong)pbVar4[0x233] & 1) << 0x11);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffffbffff | ((ulong)pbVar4[0x235] & 1) << 0x12);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffff7ffff | ((ulong)pbVar5[0x11] & 1) << 0x13);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffffcfffff | ((ulong)pbVar5[0x12] & 3) << 0x14);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffffbfffff | ((ulong)pbVar4[0x23d] & 1) << 0x16);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffff7fffff | ((ulong)pbVar4[0x23e] & 1) << 0x17);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffeffffff | ((ulong)pbVar4[0x24b] & 1) << 0x18);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffdffffff | ((ulong)pbVar5[0xb2] & 1) << 0x19);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffffbffffff | ((ulong)pbVar5[0xe4] & 1) << 0x1a);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffff7ffffff | ((ulong)pbVar5[0xe7] & 1) << 0x1b);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffefffffff | ((ulong)pbVar4[0x22e] & 1) << 0x1c);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffdfffffff | ((ulong)pbVar5[0xe9] & 1) << 0x1d);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffffbfffffff | ((ulong)pbVar5[0x10] & 1) << 0x1e);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffff7fffffff | ((ulong)pbVar5[0x290] & 1) << 0x1f);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffeffffffff | ((ulong)pbVar5[0x291] & 1) << 0x20);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffdffffffff | ((ulong)pbVar5[0x293] & 1) << 0x21);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffffbffffffff | ((ulong)pbVar5[0xa2] & 1) << 0x22);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffc7ffffffff | ((ulong)pbVar5[0x28f] & 7) << 0x23);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffffbfffffffff | ((ulong)pbVar5[0xe8] & 1) << 0x26);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xffffff7fffffffff | ((ulong)pbVar4[0x236] & 1) << 0x27);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffeffffffffff | 0x10000000000);
  pp->field_10 = (anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10)
                 ((ulong)pp->field_10 & 0xfffffdffffffffff | ((ulong)pbVar5[0xf] & 1) << 0x29);
  (pp->format).frame_type = pbVar5[0xc];
  (pp->format).show_frame = pbVar5[0xd];
  (pp->format).showable_frame = pbVar5[0xe];
  (pp->format).subsampling_x = pbVar4[0x247];
  (pp->format).subsampling_y = pbVar4[0x248];
  (pp->format).mono_chrome = pbVar4[0x241];
  pp->coded_lossless = *(UCHAR *)((long)pvVar3 + 0x1b54);
  pp->all_lossless = *(RK_S32 *)((long)pvVar3 + 0x1bc0);
  pp->primary_ref_frame = pbVar5[0x9c];
  pp->enable_order_hint = pbVar4[0x234];
  pp->order_hint = pbVar5[0x19];
  if (pbVar4[0x234] == 0) {
    UVar7 = '\0';
  }
  else {
    UVar7 = pbVar4[0x23b] + 1;
  }
  pp->order_hint_bits = UVar7;
  pp->ref_frame_valued = (uint)pbVar5[0xbe];
  for (loop_cnt = 0; loop_cnt < 7; loop_cnt = loop_cnt + 1) {
    pp->ref_frame_idx[loop_cnt] = (int)(char)pbVar5[(long)loop_cnt + 0xbf];
  }
  memset(pp->RefFrameMapTextureIndex,0xff,8);
  RVar8 = mpp_get_soc_type();
  iVar9 = 8;
  if (RVar8 == ROCKCHIP_SOC_RK3588) {
    iVar9 = 7;
  }
  for (loop_cnt = 0; loop_cnt < iVar9; loop_cnt = loop_cnt + 1) {
    if (RVar8 == ROCKCHIP_SOC_RK3588) {
      lVar11 = (long)(char)pbVar5[(long)loop_cnt + 0xbf];
    }
    else {
      lVar11 = (long)loop_cnt;
    }
    ref_i = (RefInfo_conflict *)((long)pvVar3 + lVar11 * 0x2f8 + 0xa8);
    lVar11 = *(long *)&ref_i[0xf].alt2_frame_offset;
    lVar6._0_4_ = ref_i->ref_count;
    lVar6._4_4_ = ref_i->invisible;
    if (lVar6 != 0) {
      RVar10 = mpp_frame_get_width(*(MppFrame *)ref_i);
      pp->frame_refs[loop_cnt].width = RVar10;
      RVar10 = mpp_frame_get_height(*(MppFrame *)ref_i);
      pp->frame_refs[loop_cnt].height = RVar10;
    }
    pp->frame_refs[loop_cnt].Index = (CHAR)ref_i->is_output;
    pp->frame_refs[loop_cnt].order_hint = (uint)(byte)ref_i->alt2_frame_offset;
    if (lVar11 != 0) {
      pp->frame_refs[loop_cnt].lst_frame_offset = *(UINT32 *)(lVar11 + 0xc);
      pp->frame_refs[loop_cnt].lst2_frame_offset = *(UINT32 *)(lVar11 + 0x10);
      pp->frame_refs[loop_cnt].lst3_frame_offset = *(UINT32 *)(lVar11 + 0x14);
      pp->frame_refs[loop_cnt].gld_frame_offset = *(UINT32 *)(lVar11 + 0x18);
      pp->frame_refs[loop_cnt].bwd_frame_offset = *(UINT32 *)(lVar11 + 0x1c);
      pp->frame_refs[loop_cnt].alt2_frame_offset = *(UINT32 *)(lVar11 + 0x20);
      pp->frame_refs[loop_cnt].alt_frame_offset = *(UINT32 *)(lVar11 + 0x24);
      pp->frame_refs[loop_cnt].is_intra_frame = *(UINT32 *)(lVar11 + 0x28);
      pp->frame_refs[loop_cnt].intra_only = *(UINT32 *)(lVar11 + 0x2c);
    }
    pp->frame_refs[loop_cnt].wminvalid =
         *(int *)((long)pvVar3 + (long)(loop_cnt + 1) * 0x44 + 0x188c) == 0;
    pp->frame_refs[loop_cnt].wmtype =
         (UCHAR)*(undefined4 *)((long)pvVar3 + (long)(loop_cnt + 1) * 0x44 + 0x188c);
    for (uses_lr = 0; uses_lr < 6; uses_lr = uses_lr + 1) {
      pp->frame_refs[loop_cnt].wmmat[uses_lr] =
           *(RK_S32 *)((long)pvVar3 + (long)uses_lr * 4 + (long)(loop_cnt + 1) * 0x44 + 0x1890);
      pp->frame_refs[loop_cnt].wmmat_val[uses_lr] =
           *(RK_S32 *)((long)pvVar3 + (long)uses_lr * 4 + (long)(loop_cnt + 1) * 0x44 + 0x18a8);
    }
    pp->frame_refs[loop_cnt].alpha =
         (USHORT)*(undefined4 *)((long)pvVar3 + (long)(loop_cnt + 1) * 0x44 + 0x18c0);
    pp->frame_refs[loop_cnt].beta =
         (USHORT)*(undefined4 *)((long)pvVar3 + (long)(loop_cnt + 1) * 0x44 + 0x18c4);
    pp->frame_refs[loop_cnt].gamma =
         (USHORT)*(undefined4 *)((long)pvVar3 + (long)(loop_cnt + 1) * 0x44 + 0x18c8);
    pp->frame_refs[loop_cnt].delta =
         (USHORT)*(undefined4 *)((long)pvVar3 + (long)(loop_cnt + 1) * 0x44 + 0x18cc);
  }
  for (loop_cnt = 0; loop_cnt < 8; loop_cnt = loop_cnt + 1) {
    pp->frame_ref_state[loop_cnt].valid =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3c4);
    pp->frame_ref_state[loop_cnt].frame_id =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3c8);
    pp->frame_ref_state[loop_cnt].upscaled_width =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3cc);
    pp->frame_ref_state[loop_cnt].frame_width =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3d0);
    pp->frame_ref_state[loop_cnt].frame_height =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3d4);
    pp->frame_ref_state[loop_cnt].render_width =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3d8);
    pp->frame_ref_state[loop_cnt].render_height =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3dc);
    pp->frame_ref_state[loop_cnt].frame_type =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3e0);
    pp->frame_ref_state[loop_cnt].subsampling_x =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3e4);
    pp->frame_ref_state[loop_cnt].subsampling_y =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3e8);
    pp->frame_ref_state[loop_cnt].bit_depth =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3ec);
    pp->frame_ref_state[loop_cnt].order_hint =
         *(RK_S32 *)((long)pvVar3 + (long)loop_cnt * 0xfc + 0x1d3f0);
    pp->ref_order_hint[loop_cnt] = (uint)pbVar5[(long)loop_cnt + 0xb3];
    if (*(int *)((long)pvVar3 + (long)loop_cnt * 0x2f8 + 0xb0) < 0x7f) {
      pp->RefFrameMapTextureIndex[loop_cnt] =
           (UCHAR)*(undefined4 *)((long)pvVar3 + (long)loop_cnt * 0x2f8 + 0xb0);
    }
    else {
      pp->RefFrameMapTextureIndex[loop_cnt] = 0xff;
    }
  }
  (pp->loop_filter).filter_level[0] = pbVar5[0x24d];
  (pp->loop_filter).filter_level[1] = pbVar5[0x24e];
  (pp->loop_filter).filter_level_u = pbVar5[0x24f];
  (pp->loop_filter).filter_level_v = pbVar5[0x250];
  (pp->loop_filter).sharpness_level = pbVar5[0x251];
  (pp->loop_filter).mode_ref_delta_enabled = pbVar5[0x252];
  (pp->loop_filter).mode_ref_delta_update = pbVar5[0x253];
  (pp->loop_filter).delta_lf_multi = pbVar5[0x24c];
  (pp->loop_filter).delta_lf_present = pbVar5[0x24a];
  (pp->loop_filter).delta_lf_res = pbVar5[0x24b];
  for (loop_cnt = 0; loop_cnt < 8; loop_cnt = loop_cnt + 1) {
    (pp->loop_filter).ref_deltas[loop_cnt] = pbVar5[(long)loop_cnt + 0x25c];
  }
  (pp->loop_filter).mode_deltas[0] = pbVar5[0x266];
  (pp->loop_filter).mode_deltas[1] = pbVar5[0x267];
  (pp->loop_filter).frame_restoration_type[0] = aUStack_54[pbVar5[0x28a]];
  (pp->loop_filter).frame_restoration_type[1] = aUStack_54[pbVar5[0x28b]];
  (pp->loop_filter).frame_restoration_type[2] = aUStack_54[pbVar5[0x28c]];
  bVar12 = true;
  if ((pbVar5[0x28a] == 0) && (bVar12 = true, pbVar5[0x28b] == 0)) {
    bVar12 = pbVar5[0x28c] != 0;
  }
  if (bVar12) {
    UVar7 = pbVar5[0x28d] + 1;
  }
  else {
    UVar7 = '\x03';
  }
  (pp->loop_filter).log2_restoration_unit_size[0] = UVar7;
  if (bVar12) {
    UVar7 = (pbVar5[0x28d] + 1) - pbVar5[0x28e];
  }
  else {
    UVar7 = '\x03';
  }
  (pp->loop_filter).log2_restoration_unit_size[1] = UVar7;
  if (bVar12) {
    UVar7 = (pbVar5[0x28d] + 1) - pbVar5[0x28e];
  }
  else {
    UVar7 = '\x03';
  }
  (pp->loop_filter).log2_restoration_unit_size[2] = UVar7;
  (pp->quantization).delta_q_present = pbVar5[0x248];
  (pp->quantization).delta_q_res = pbVar5[0x249];
  (pp->quantization).base_qindex = pbVar5[0x176];
  (pp->quantization).y_dc_delta_q = pbVar5[0x177];
  (pp->quantization).u_dc_delta_q = pbVar5[0x179];
  (pp->quantization).v_dc_delta_q = pbVar5[0x17b];
  (pp->quantization).u_ac_delta_q = pbVar5[0x17a];
  (pp->quantization).v_ac_delta_q = pbVar5[0x17c];
  (pp->quantization).using_qmatrix = pbVar5[0x17d];
  if (pbVar5[0x17d] == 0) {
    bVar2 = 0xff;
  }
  else {
    bVar2 = pbVar5[0x17e];
  }
  (pp->quantization).qm_y = bVar2;
  if (pbVar5[0x17d] == 0) {
    bVar2 = 0xff;
  }
  else {
    bVar2 = pbVar5[0x17f];
  }
  (pp->quantization).qm_u = bVar2;
  if (pbVar5[0x17d] == 0) {
    bVar2 = 0xff;
  }
  else {
    bVar2 = pbVar5[0x180];
  }
  (pp->quantization).qm_v = bVar2;
  (pp->cdef).damping = pbVar5[0x268];
  (pp->cdef).bits = pbVar5[0x269];
  for (loop_cnt = 0; loop_cnt < 8; loop_cnt = loop_cnt + 1) {
    (pp->cdef).y_strengths[loop_cnt].primary = pbVar5[(long)loop_cnt + 0x26a];
    (pp->cdef).y_strengths[loop_cnt].secondary = pbVar5[(long)loop_cnt + 0x272];
    (pp->cdef).uv_strengths[loop_cnt].primary = pbVar5[(long)loop_cnt + 0x27a];
    (pp->cdef).uv_strengths[loop_cnt].secondary = pbVar5[(long)loop_cnt + 0x282];
  }
  pp->interp_filter = pbVar5[0xe6];
  (pp->segmentation).enabled = pbVar5[0x181];
  (pp->segmentation).update_map = pbVar5[0x182];
  (pp->segmentation).update_data = pbVar5[0x184];
  (pp->segmentation).temporal_update = pbVar5[0x183];
  for (loop_cnt = 0; loop_cnt < 8; loop_cnt = loop_cnt + 1) {
    for (uses_lr = 0; uses_lr < 8; uses_lr = uses_lr + 1) {
      (pp->segmentation).feature_mask[loop_cnt] =
           (pp->segmentation).feature_mask[loop_cnt] |
           pbVar5[(long)uses_lr + (long)loop_cnt * 8 + 0x185] << ((byte)uses_lr & 0x1f);
      (pp->segmentation).feature_data[loop_cnt][uses_lr] =
           (int)*(short *)(pbVar5 + (long)uses_lr * 2 + (long)loop_cnt * 0x10 + 0x1c6);
    }
  }
  (pp->segmentation).last_active = pbVar5[0x246];
  (pp->segmentation).preskip = pbVar5[0x247];
  (pp->film_grain).matrix_coefficients = pbVar4[0x245];
  if (cVar1 != '\0') {
    (pp->film_grain).apply_grain = '\x01';
    (pp->film_grain).scaling_shift_minus8 = _apply_grain[0x4e];
    (pp->film_grain).chroma_scaling_from_luma = _apply_grain[0x23];
    (pp->film_grain).ar_coeff_lag = _apply_grain[0x4f];
    (pp->film_grain).ar_coeff_shift_minus6 = _apply_grain[0x9a];
    (pp->film_grain).grain_scale_shift = _apply_grain[0x9b];
    (pp->film_grain).overlap_flag = _apply_grain[0xa4];
    (pp->film_grain).clip_to_restricted_range = _apply_grain[0xa5];
    (pp->film_grain).matrix_coeff_is_identity = pbVar4[0x245] == 0;
    (pp->film_grain).grain_seed = *(USHORT *)(_apply_grain + 2);
    (pp->film_grain).update_grain = (ushort)(byte)_apply_grain[4];
    (pp->film_grain).num_y_points = _apply_grain[6];
    for (loop_cnt = 0; loop_cnt < (int)(uint)(byte)_apply_grain[6]; loop_cnt = loop_cnt + 1) {
      (pp->film_grain).scaling_points_y[loop_cnt][0] = _apply_grain[(long)loop_cnt + 7];
      (pp->film_grain).scaling_points_y[loop_cnt][1] = _apply_grain[(long)loop_cnt + 0x15];
    }
    (pp->film_grain).num_cb_points = _apply_grain[0x24];
    for (loop_cnt = 0; loop_cnt < (int)(uint)(byte)_apply_grain[0x24]; loop_cnt = loop_cnt + 1) {
      (pp->film_grain).scaling_points_cb[loop_cnt][0] = _apply_grain[(long)loop_cnt + 0x25];
      (pp->film_grain).scaling_points_cb[loop_cnt][1] = _apply_grain[(long)loop_cnt + 0x2f];
    }
    (pp->film_grain).num_cr_points = _apply_grain[0x39];
    for (loop_cnt = 0; loop_cnt < (int)(uint)(byte)_apply_grain[0x39]; loop_cnt = loop_cnt + 1) {
      (pp->film_grain).scaling_points_cr[loop_cnt][0] = _apply_grain[(long)loop_cnt + 0x3a];
      (pp->film_grain).scaling_points_cr[loop_cnt][1] = _apply_grain[(long)loop_cnt + 0x44];
    }
    for (loop_cnt = 0; loop_cnt < 0x18; loop_cnt = loop_cnt + 1) {
      (pp->film_grain).ar_coeffs_y[loop_cnt] = _apply_grain[(long)loop_cnt + 0x50];
    }
    for (loop_cnt = 0; loop_cnt < 0x19; loop_cnt = loop_cnt + 1) {
      (pp->film_grain).ar_coeffs_cb[loop_cnt] = _apply_grain[(long)loop_cnt + 0x68];
      (pp->film_grain).ar_coeffs_cr[loop_cnt] = _apply_grain[(long)loop_cnt + 0x81];
    }
    (pp->film_grain).cb_mult = _apply_grain[0x9c];
    (pp->film_grain).cb_luma_mult = _apply_grain[0x9d];
    (pp->film_grain).cr_mult = _apply_grain[0xa0];
    (pp->film_grain).cr_luma_mult = _apply_grain[0xa1];
    (pp->film_grain).cb_offset = *(USHORT *)(_apply_grain + 0x9e);
    (pp->film_grain).cr_offset = *(USHORT *)(_apply_grain + 0xa2);
    (pp->film_grain).cr_offset = *(USHORT *)(_apply_grain + 0xa2);
  }
  pp->upscaled_width = *(UINT32 *)((long)pvVar3 + 0x1bac);
  pp->frame_to_show_map_idx = (uint)pbVar5[1];
  pp->show_existing_frame = (uint)*pbVar5;
  pp->frame_tag_size = *(UINT32 *)((long)pvVar3 + 0x1bd8);
  pp->skip_ref0 = *(UCHAR *)((long)pvVar3 + 0x1dbb8);
  pp->skip_ref1 = *(UCHAR *)((long)pvVar3 + 0x1dbb9);
  pp->refresh_frame_flags = pbVar5[0xb1];
  pp->cdfs = *(void **)((long)pvVar3 + 0x1be8);
  pp->cdfs_ndvc = *(void **)((long)pvVar3 + 0x1bf0);
  pp->tile_cols_log2 = pbVar5[0xeb];
  pp->tile_rows_log2 = pbVar5[0xec];
  return 0;
}

Assistant:

static int av1d_fill_picparams(Av1CodecContext *ctx, DXVA_PicParams_AV1 *pp)
{
    int i, j, loop_cnt, uses_lr;
    RK_U8 is_rk3588;
    AV1Context *h = ctx->priv_data;
    const AV1RawSequenceHeader *seq = h->sequence_header;
    const AV1RawFrameHeader *frame_header = h->raw_frame_header;
    const AV1RawFilmGrainParams *film_grain = &h->cur_frame.film_grain;

    unsigned char remap_lr_type[4] = { AV1_RESTORE_NONE, AV1_RESTORE_SWITCHABLE, AV1_RESTORE_WIENER, AV1_RESTORE_SGRPROJ };
    // int apply_grain = !(ctx->export_side_data & AV_CODEC_EXPORT_DATA_FILM_GRAIN) && film_grain->apply_grain;
    int apply_grain = film_grain->apply_grain;

    memset(pp, 0, sizeof(*pp));

    pp->width  = h->frame_width;
    pp->height = h->frame_height;

    pp->max_width  = seq->max_frame_width_minus_1 + 1;
    pp->max_height = seq->max_frame_height_minus_1 + 1;

    pp->CurrPic.Index7Bits  = h->cur_frame.slot_index;
    pp->CurrPicTextureIndex = h->cur_frame.slot_index;
    pp->superres_denom      = frame_header->use_superres ? frame_header->coded_denom : AV1_SUPERRES_NUM;
    pp->bitdepth            = h->bit_depth;
    pp->seq_profile         = seq->seq_profile;
    pp->frame_header_size   = h->frame_header_size;

    /* Tiling info */
    pp->tiles.cols = frame_header->tile_cols;
    pp->tiles.rows = frame_header->tile_rows;
    pp->tiles.context_update_id = frame_header->context_update_tile_id;

    for (i = 0; i < pp->tiles.cols; i++)
        pp->tiles.widths[i] = frame_header->width_in_sbs_minus_1[i] + 1;

    for (i = 0; i < pp->tiles.rows; i++)
        pp->tiles.heights[i] = frame_header->height_in_sbs_minus_1[i] + 1;

    for (i = 0; i < AV1_MAX_TILES; i++) {
        pp->tiles.tile_offset_start[i] = h->tile_offset_start[i];
        pp->tiles.tile_offset_end[i] = h->tile_offset_end[i];
    }

    pp->tiles.tile_sz_mag = h->raw_frame_header->tile_size_bytes_minus1;
    /* Coding tools */
    pp->coding.current_operating_point      = seq->operating_point_idc[h->operating_point_idc];
    pp->coding.use_128x128_superblock       = seq->use_128x128_superblock;
    pp->coding.intra_edge_filter            = seq->enable_intra_edge_filter;
    pp->coding.interintra_compound          = seq->enable_interintra_compound;
    pp->coding.masked_compound              = seq->enable_masked_compound;
    pp->coding.warped_motion                = frame_header->allow_warped_motion;
    pp->coding.dual_filter                  = seq->enable_dual_filter;
    pp->coding.jnt_comp                     = seq->enable_jnt_comp;
    pp->coding.screen_content_tools         = frame_header->allow_screen_content_tools;
    pp->coding.integer_mv                   = frame_header->force_integer_mv;

    pp->coding.cdef_en                      = seq->enable_cdef;
    pp->coding.restoration                  = seq->enable_restoration;
    pp->coding.film_grain_en                = seq->film_grain_params_present  ;//&& !(avctx->export_side_data & AV_CODEC_EXPORT_DATA_FILM_GRAIN);
    pp->coding.intrabc                      = frame_header->allow_intrabc;
    pp->coding.high_precision_mv            = frame_header->allow_high_precision_mv;
    pp->coding.switchable_motion_mode       = frame_header->is_motion_mode_switchable;
    pp->coding.filter_intra                 = seq->enable_filter_intra;
    pp->coding.disable_frame_end_update_cdf = frame_header->disable_frame_end_update_cdf;
    pp->coding.disable_cdf_update           = frame_header->disable_cdf_update;
    pp->coding.reference_mode               = frame_header->reference_select;
    pp->coding.skip_mode                    = frame_header->skip_mode_present;
    pp->coding.reduced_tx_set               = frame_header->reduced_tx_set;
    pp->coding.superres                     = frame_header->use_superres;
    pp->coding.tx_mode                      = frame_header->tx_mode;
    pp->coding.use_ref_frame_mvs            = frame_header->use_ref_frame_mvs;
    pp->coding.enable_ref_frame_mvs         = seq->enable_ref_frame_mvs;
    pp->coding.reference_frame_update       = 1; // 0 for show_existing_frame with key frames, but those are not passed to the hwaccel
    pp->coding.error_resilient_mode         = frame_header->error_resilient_mode;

    /* Format & Picture Info flags */
    pp->format.frame_type     = frame_header->frame_type;
    pp->format.show_frame     = frame_header->show_frame;
    pp->format.showable_frame = frame_header->showable_frame;
    pp->format.subsampling_x  = seq->color_config.subsampling_x;
    pp->format.subsampling_y  = seq->color_config.subsampling_y;
    pp->format.mono_chrome    = seq->color_config.mono_chrome;
    pp->coded_lossless        = h->cur_frame.coded_lossless;
    pp->all_lossless          = h->all_lossless;
    /* References */
    pp->primary_ref_frame = frame_header->primary_ref_frame;
    pp->enable_order_hint = seq->enable_order_hint;
    pp->order_hint        = frame_header->order_hint;
    pp->order_hint_bits   = seq->enable_order_hint ? seq->order_hint_bits_minus_1 + 1 : 0;

    pp->ref_frame_valued = frame_header->ref_frame_valued;
    for (i = 0; i < AV1_REFS_PER_FRAME; i++)
        pp->ref_frame_idx[i] = frame_header->ref_frame_idx[i];

    memset(pp->RefFrameMapTextureIndex, 0xFF, sizeof(pp->RefFrameMapTextureIndex));
    is_rk3588 = mpp_get_soc_type() == ROCKCHIP_SOC_RK3588;
    loop_cnt = is_rk3588 ? AV1_REFS_PER_FRAME : AV1_NUM_REF_FRAMES;
    for (i = 0; i < loop_cnt; i++) {
        int8_t ref_idx = frame_header->ref_frame_idx[i];
        AV1Frame *ref_frame;
        RefInfo *ref_i;

        if (is_rk3588)
            ref_frame = &h->ref[ref_idx];
        else
            ref_frame = &h->ref[i];
        ref_i = ref_frame->ref;

        if (ref_frame->f) {
            pp->frame_refs[i].width  = mpp_frame_get_width(ref_frame->f);
            pp->frame_refs[i].height = mpp_frame_get_height(ref_frame->f);;
        }
        pp->frame_refs[i].Index  = ref_frame->slot_index;
        pp->frame_refs[i].order_hint = ref_frame->order_hint;
        if (ref_i) {
            pp->frame_refs[i].lst_frame_offset = ref_i->lst_frame_offset;
            pp->frame_refs[i].lst2_frame_offset = ref_i->lst2_frame_offset;
            pp->frame_refs[i].lst3_frame_offset = ref_i->lst3_frame_offset;
            pp->frame_refs[i].gld_frame_offset = ref_i->gld_frame_offset;
            pp->frame_refs[i].bwd_frame_offset = ref_i->bwd_frame_offset;
            pp->frame_refs[i].alt2_frame_offset = ref_i->alt2_frame_offset;
            pp->frame_refs[i].alt_frame_offset = ref_i->alt_frame_offset ;
            pp->frame_refs[i].is_intra_frame = ref_i->is_intra_frame;
            pp->frame_refs[i].intra_only = ref_i->intra_only;
        }
        /* Global Motion */
        pp->frame_refs[i].wminvalid = (h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].wmtype == AV1_WARP_MODEL_IDENTITY);
        pp->frame_refs[i].wmtype    = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].wmtype;
        for (j = 0; j < 6; ++j) {
            pp->frame_refs[i].wmmat[j] = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].wmmat[j];
            pp->frame_refs[i].wmmat_val[j] = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].wmmat_val[j];
        }
        pp->frame_refs[i].alpha = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].alpha;
        pp->frame_refs[i].beta = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].beta;
        pp->frame_refs[i].gamma = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].gamma;
        pp->frame_refs[i].delta = h->cur_frame.gm_params[AV1_REF_FRAME_LAST + i].delta;
    }
    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        AV1Frame *ref_frame = &h->ref[i];

        pp->frame_ref_state[i].valid           = h->ref_s[i].valid         ;
        pp->frame_ref_state[i].frame_id        = h->ref_s[i].frame_id      ;
        pp->frame_ref_state[i].upscaled_width  = h->ref_s[i].upscaled_width;
        pp->frame_ref_state[i].frame_width     = h->ref_s[i].frame_width   ;
        pp->frame_ref_state[i].frame_height    = h->ref_s[i].frame_height  ;
        pp->frame_ref_state[i].render_width    = h->ref_s[i].render_width  ;
        pp->frame_ref_state[i].render_height   = h->ref_s[i].render_height ;
        pp->frame_ref_state[i].frame_type      = h->ref_s[i].frame_type    ;
        pp->frame_ref_state[i].subsampling_x   = h->ref_s[i].subsampling_x ;
        pp->frame_ref_state[i].subsampling_y   = h->ref_s[i].subsampling_y ;
        pp->frame_ref_state[i].bit_depth       = h->ref_s[i].bit_depth     ;
        pp->frame_ref_state[i].order_hint      = h->ref_s[i].order_hint    ;

        pp->ref_order_hint[i] = frame_header->ref_order_hint[i];

        if (ref_frame->slot_index < 0x7f)
            pp->RefFrameMapTextureIndex[i] = ref_frame->slot_index;
        else
            pp->RefFrameMapTextureIndex[i] = 0xff;
    }

    /* Loop filter parameters */
    pp->loop_filter.filter_level[0]        = frame_header->loop_filter_level[0];
    pp->loop_filter.filter_level[1]        = frame_header->loop_filter_level[1];
    pp->loop_filter.filter_level_u         = frame_header->loop_filter_level[2];
    pp->loop_filter.filter_level_v         = frame_header->loop_filter_level[3];
    pp->loop_filter.sharpness_level        = frame_header->loop_filter_sharpness;
    pp->loop_filter.mode_ref_delta_enabled = frame_header->loop_filter_delta_enabled;
    pp->loop_filter.mode_ref_delta_update  = frame_header->loop_filter_delta_update;
    pp->loop_filter.delta_lf_multi         = frame_header->delta_lf_multi;
    pp->loop_filter.delta_lf_present       = frame_header->delta_lf_present;
    pp->loop_filter.delta_lf_res           = frame_header->delta_lf_res;

    for (i = 0; i < AV1_TOTAL_REFS_PER_FRAME; i++) {
        pp->loop_filter.ref_deltas[i] = frame_header->loop_filter_ref_deltas[i];
    }

    pp->loop_filter.mode_deltas[0]                = frame_header->loop_filter_mode_deltas[0];
    pp->loop_filter.mode_deltas[1]                = frame_header->loop_filter_mode_deltas[1];
    pp->loop_filter.frame_restoration_type[0]     = remap_lr_type[frame_header->lr_type[0]];
    pp->loop_filter.frame_restoration_type[1]     = remap_lr_type[frame_header->lr_type[1]];
    pp->loop_filter.frame_restoration_type[2]     = remap_lr_type[frame_header->lr_type[2]];
    uses_lr = frame_header->lr_type[0] || frame_header->lr_type[1] || frame_header->lr_type[2];
    pp->loop_filter.log2_restoration_unit_size[0] = uses_lr ? (1 + frame_header->lr_unit_shift) : 3;
    pp->loop_filter.log2_restoration_unit_size[1] = uses_lr ? (1 + frame_header->lr_unit_shift - frame_header->lr_uv_shift) : 3;
    pp->loop_filter.log2_restoration_unit_size[2] = uses_lr ? (1 + frame_header->lr_unit_shift - frame_header->lr_uv_shift) : 3;

    /* Quantization */
    pp->quantization.delta_q_present = frame_header->delta_q_present;
    pp->quantization.delta_q_res     = frame_header->delta_q_res;
    pp->quantization.base_qindex     = frame_header->base_q_idx;
    pp->quantization.y_dc_delta_q    = frame_header->delta_q_y_dc;
    pp->quantization.u_dc_delta_q    = frame_header->delta_q_u_dc;
    pp->quantization.v_dc_delta_q    = frame_header->delta_q_v_dc;
    pp->quantization.u_ac_delta_q    = frame_header->delta_q_u_ac;
    pp->quantization.v_ac_delta_q    = frame_header->delta_q_v_ac;
    pp->quantization.using_qmatrix   = frame_header->using_qmatrix;
    pp->quantization.qm_y            = frame_header->using_qmatrix ? frame_header->qm_y : 0xFF;
    pp->quantization.qm_u            = frame_header->using_qmatrix ? frame_header->qm_u : 0xFF;
    pp->quantization.qm_v            = frame_header->using_qmatrix ? frame_header->qm_v : 0xFF;

    /* Cdef parameters */
    pp->cdef.damping = frame_header->cdef_damping_minus_3;
    pp->cdef.bits    = frame_header->cdef_bits;
    for (i = 0; i < 8; i++) {
        pp->cdef.y_strengths[i].primary    = frame_header->cdef_y_pri_strength[i];
        pp->cdef.y_strengths[i].secondary  = frame_header->cdef_y_sec_strength[i];
        pp->cdef.uv_strengths[i].primary   = frame_header->cdef_uv_pri_strength[i];
        pp->cdef.uv_strengths[i].secondary = frame_header->cdef_uv_sec_strength[i];
    }

    /* Misc flags */
    pp->interp_filter = frame_header->interpolation_filter;

    /* Segmentation */
    pp->segmentation.enabled         = frame_header->segmentation_enabled;
    pp->segmentation.update_map      = frame_header->segmentation_update_map;
    pp->segmentation.update_data     = frame_header->segmentation_update_data;
    pp->segmentation.temporal_update = frame_header->segmentation_temporal_update;
    for (i = 0; i < AV1_MAX_SEGMENTS; i++) {
        for (j = 0; j < AV1_SEG_LVL_MAX; j++) {
            pp->segmentation.feature_mask[i]      |= frame_header->feature_enabled[i][j] << j;
            pp->segmentation.feature_data[i][j]    = frame_header->feature_value[i][j];
        }
    }
    pp->segmentation.last_active     = frame_header->segmentation_id_last_active;
    pp->segmentation.preskip         = frame_header->segmentation_id_preskip;

    /* Film grain */
    pp->film_grain.matrix_coefficients      = seq->color_config.matrix_coefficients;
    if (apply_grain) {
        pp->film_grain.apply_grain              = 1;
        pp->film_grain.scaling_shift_minus8     = film_grain->grain_scaling_minus_8;
        pp->film_grain.chroma_scaling_from_luma = film_grain->chroma_scaling_from_luma;
        pp->film_grain.ar_coeff_lag             = film_grain->ar_coeff_lag;
        pp->film_grain.ar_coeff_shift_minus6    = film_grain->ar_coeff_shift_minus_6;
        pp->film_grain.grain_scale_shift        = film_grain->grain_scale_shift;
        pp->film_grain.overlap_flag             = film_grain->overlap_flag;
        pp->film_grain.clip_to_restricted_range = film_grain->clip_to_restricted_range;
        pp->film_grain.matrix_coeff_is_identity = (seq->color_config.matrix_coefficients == MPP_FRAME_SPC_RGB);

        pp->film_grain.grain_seed               = film_grain->grain_seed;
        pp->film_grain.update_grain             = film_grain->update_grain;
        pp->film_grain.num_y_points             = film_grain->num_y_points;
        for (i = 0; i < film_grain->num_y_points; i++) {
            pp->film_grain.scaling_points_y[i][0] = film_grain->point_y_value[i];
            pp->film_grain.scaling_points_y[i][1] = film_grain->point_y_scaling[i];
        }
        pp->film_grain.num_cb_points            = film_grain->num_cb_points;
        for (i = 0; i < film_grain->num_cb_points; i++) {
            pp->film_grain.scaling_points_cb[i][0] = film_grain->point_cb_value[i];
            pp->film_grain.scaling_points_cb[i][1] = film_grain->point_cb_scaling[i];
        }
        pp->film_grain.num_cr_points            = film_grain->num_cr_points;
        for (i = 0; i < film_grain->num_cr_points; i++) {
            pp->film_grain.scaling_points_cr[i][0] = film_grain->point_cr_value[i];
            pp->film_grain.scaling_points_cr[i][1] = film_grain->point_cr_scaling[i];
        }
        for (i = 0; i < 24; i++) {
            pp->film_grain.ar_coeffs_y[i] = film_grain->ar_coeffs_y_plus_128[i];
        }
        for (i = 0; i < 25; i++) {
            pp->film_grain.ar_coeffs_cb[i] = film_grain->ar_coeffs_cb_plus_128[i];
            pp->film_grain.ar_coeffs_cr[i] = film_grain->ar_coeffs_cr_plus_128[i];
        }
        pp->film_grain.cb_mult      = film_grain->cb_mult;
        pp->film_grain.cb_luma_mult = film_grain->cb_luma_mult;
        pp->film_grain.cr_mult      = film_grain->cr_mult;
        pp->film_grain.cr_luma_mult = film_grain->cr_luma_mult;
        pp->film_grain.cb_offset    = film_grain->cb_offset;
        pp->film_grain.cr_offset    = film_grain->cr_offset;
        pp->film_grain.cr_offset    = film_grain->cr_offset;
    }
    pp->upscaled_width = h->upscaled_width;
    pp->frame_to_show_map_idx = frame_header->frame_to_show_map_idx;
    pp->show_existing_frame = frame_header->show_existing_frame;
    pp->frame_tag_size = h->frame_tag_size;
    pp->skip_ref0      = h->skip_ref0;
    pp->skip_ref1      = h->skip_ref1;
    pp->refresh_frame_flags = frame_header->refresh_frame_flags;

    pp->cdfs = h->cdfs;
    pp->cdfs_ndvc = h->cdfs_ndvc;
    pp->tile_cols_log2 = frame_header->tile_cols_log2;
    pp->tile_rows_log2 = frame_header->tile_rows_log2;
    // XXX: Setting the StatusReportFeedbackNumber breaks decoding on some drivers (tested on NVIDIA 457.09)
    // Status Reporting is not used by FFmpeg, hence not providing a number does not cause any issues
    //pp->StatusReportFeedbackNumber = 1 + DXVA_CONTEXT_REPORT_ID(avctx, ctx)++;
    return 0;
}